

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

void __thiscall CBlockPolicyEstimator::FlushFeeEstimates(CBlockPolicyEstimator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar3;
  FILE *file;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  void *pvVar4;
  long lVar5;
  AutoFile est_file;
  path local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  file = fsbridge::fopen((char *)&this->m_estimation_filepath,"wb");
  pvVar4 = (void *)0x0;
  lVar5 = 0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&est_file,(FILE *)file,data_xor);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,lVar5 - (long)pvVar4);
  }
  if (est_file.m_file != (FILE *)0x0) {
    bVar3 = Write(this,&est_file);
    if (bVar3) {
      fs::path::filename((path *)&local_60,&this->m_estimation_filepath);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,local_60._M_pathname._M_dataplus._M_p,
                 local_60._M_pathname._M_dataplus._M_p + local_60._M_pathname._M_string_length);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "FlushFeeEstimates";
      logging_function._M_len = 0x11;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x3bc,ALL,Info,(ConstevalFormatString<1U>)0xf97efa,
                 &local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::__cxx11::path::~path(&local_60);
      goto LAB_009765a5;
    }
  }
  pcVar2 = (this->m_estimation_filepath).super_path._M_pathname._M_dataplus._M_p;
  paVar1 = &local_60._M_pathname.field_2;
  local_60._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,pcVar2,
             pcVar2 + (this->m_estimation_filepath).super_path._M_pathname._M_string_length);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
  ;
  source_file_00._M_len = 0x5f;
  logging_function_00._M_str = "FlushFeeEstimates";
  logging_function_00._M_len = 0x11;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_00,source_file_00,0x3ba,ALL,Info,(ConstevalFormatString<1U>)0xf97ec3,
             &local_60._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_pathname._M_dataplus._M_p,
                    local_60._M_pathname.field_2._M_allocated_capacity + 1);
  }
LAB_009765a5:
  AutoFile::~AutoFile(&est_file);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::FlushFeeEstimates()
{
    AutoFile est_file{fsbridge::fopen(m_estimation_filepath, "wb")};
    if (est_file.IsNull() || !Write(est_file)) {
        LogPrintf("Failed to write fee estimates to %s. Continue anyway.\n", fs::PathToString(m_estimation_filepath));
    } else {
        LogPrintf("Flushed fee estimates to %s.\n", fs::PathToString(m_estimation_filepath.filename()));
    }
}